

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any.cpp
# Opt level: O1

bool __thiscall big_type::check(big_type *this)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->value)._M_string_length == 300) {
    pcVar2 = (this->value)._M_dataplus._M_p;
    if ((*pcVar2 == 'b') && (pcVar2[299] == 'b')) {
      if ((this->i_wanna_be_big[0] == 'k') && (this->i_wanna_be_big[0x32] == 'k')) {
        return true;
      }
      pcVar2 = "i_wanna_be_big[0] == \'k\' && i_wanna_be_big[50] == \'k\'";
      uVar1 = 0x25;
    }
    else {
      pcVar2 = "value.front() == \'b\' && value.back() == \'b\'";
      uVar1 = 0x24;
    }
  }
  else {
    pcVar2 = "value.size() == 300";
    uVar1 = 0x23;
  }
  fprintf(_stdout,"Failed at %d:%s: %s\n",uVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/thelink2012[P]any/test_any.cpp",pcVar2)
  ;
  exit(1);
}

Assistant:

bool check()
    {
        CHECK(value.size() == 300);
        CHECK(value.front() == 'b' && value.back() == 'b');
        CHECK(i_wanna_be_big[0] == 'k' && i_wanna_be_big[50] == 'k');
        return true;
    }